

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O1

void __thiscall FLevelLocals::AddScroller(FLevelLocals *this,int secnum)

{
  if ((-1 < secnum) && ((this->Scrolls).Count == 0)) {
    TArray<TVector2<double>,_TVector2<double>_>::Resize(&this->Scrolls,numsectors);
    memset((this->Scrolls).Array,0,(long)numsectors << 4);
    return;
  }
  return;
}

Assistant:

void FLevelLocals::AddScroller (int secnum)
{
	if (secnum < 0)
	{
		return;
	}
	if (Scrolls.Size() == 0)
	{
		Scrolls.Resize(numsectors);
		memset (&Scrolls[0], 0, sizeof(Scrolls[0])*numsectors);
	}
}